

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

int get_num_mbs(BLOCK_SIZE fp_block_size,int num_mbs_16X16)

{
  byte bVar1;
  int mb_height_mi_log2;
  int mb_width_mi_log2;
  int height_mi_log2;
  int width_mi_log2;
  int num_mbs_16X16_local;
  BLOCK_SIZE fp_block_size_local;
  int local_4;
  
  bVar1 = ""[fp_block_size];
  if (bVar1 < 3) {
    local_4 = num_mbs_16X16 << (('\x04' - ""[fp_block_size]) - bVar1 & 0x1f);
  }
  else {
    local_4 = num_mbs_16X16 >> (bVar1 + ""[fp_block_size] + 0xfc & 0x1f);
  }
  return local_4;
}

Assistant:

static int get_num_mbs(const BLOCK_SIZE fp_block_size,
                       const int num_mbs_16X16) {
  const int width_mi_log2 = mi_size_wide_log2[fp_block_size];
  const int height_mi_log2 = mi_size_high_log2[fp_block_size];
  const int mb_width_mi_log2 = mi_size_wide_log2[BLOCK_16X16];
  const int mb_height_mi_log2 = mi_size_high_log2[BLOCK_16X16];
  // TODO(chengchen): Now this function assumes a square block is used.
  // It does not support rectangular block sizes.
  assert(width_mi_log2 == height_mi_log2);
  if (width_mi_log2 > mb_width_mi_log2) {
    return num_mbs_16X16 >> ((width_mi_log2 - mb_width_mi_log2) +
                             (height_mi_log2 - mb_height_mi_log2));
  }

  return num_mbs_16X16 << ((mb_width_mi_log2 - width_mi_log2) +
                           (mb_height_mi_log2 - height_mi_log2));
}